

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

bool __thiscall sylvan::Bdd::operator<=(Bdd *this,Bdd *other)

{
  sylvan *this_00;
  char cVar1;
  BDD arg_1;
  BDDVAR in_ECX;
  Bdd *other_local;
  Bdd *this_local;
  
  this_00 = (sylvan *)this->bdd;
  arg_1 = sylvan_not((sylvan *)other->bdd,(BDD)other);
  cVar1 = sylvan_disjoint_RUN(this_00,arg_1,0,in_ECX);
  return cVar1 == '\x01';
}

Assistant:

bool
Bdd::operator<=(const Bdd& other) const
{
    return sylvan_subset(this->bdd, other.bdd) == 1;
}